

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# median_filter.cc
# Opt level: O2

void __thiscall
sptk::MedianFilter::MedianFilter
          (MedianFilter *this,int num_input_order,int num_filter_order,
          InputSourceInterface *input_source,bool apply_each_dimension,bool use_magic_number,
          double magic_number)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_type __new_size;
  
  (this->super_InputSourceInterface)._vptr_InputSourceInterface =
       (_func_int **)&PTR__MedianFilter_00111c50;
  this->num_input_order_ = num_input_order;
  this->num_filter_order_ = num_filter_order;
  this->input_source_ = input_source;
  this->apply_each_dimension_ = apply_each_dimension;
  this->use_magic_number_ = use_magic_number;
  this->magic_number_ = magic_number;
  this->is_valid_ = true;
  (this->buffer_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buffer_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buffer_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->flat_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->flat_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->flat_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::
  _Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::_Deque_base(&(this->queue_).
                 super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               );
  if ((((-1 < this->num_input_order_) && (-1 < this->num_filter_order_)) &&
      (this->input_source_ != (InputSourceInterface *)0x0)) &&
     ((iVar2 = (*input_source->_vptr_InputSourceInterface[3])(input_source), (char)iVar2 != '\0' &&
      (iVar2 = (*input_source->_vptr_InputSourceInterface[2])(input_source),
      iVar2 == this->num_input_order_ + 1)))) {
    std::vector<double,_std::allocator<double>_>::resize(&this->buffer_,(long)iVar2);
    __new_size = (long)this->num_filter_order_ + 1;
    if (this->apply_each_dimension_ == false) {
      __new_size = __new_size *
                   ((long)(this->buffer_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->buffer_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 3);
    }
    std::vector<double,_std::allocator<double>_>::resize(&this->flat_,__new_size);
    iVar3 = this->num_filter_order_ / 2;
    this->count_down_ = iVar3;
    iVar2 = 0;
    if (0 < iVar3) {
      iVar2 = iVar3;
    }
    iVar2 = iVar2 + 1;
    do {
      iVar2 = iVar2 + -1;
      if (iVar2 == 0) {
        return;
      }
      bVar1 = Forward(this);
    } while (bVar1);
  }
  this->is_valid_ = false;
  return;
}

Assistant:

MedianFilter::MedianFilter(int num_input_order, int num_filter_order,
                           InputSourceInterface* input_source,
                           bool apply_each_dimension, bool use_magic_number,
                           double magic_number)
    : num_input_order_(num_input_order),
      num_filter_order_(num_filter_order),
      input_source_(input_source),
      apply_each_dimension_(apply_each_dimension),
      use_magic_number_(use_magic_number),
      magic_number_(magic_number),
      is_valid_(true) {
  if (num_input_order_ < 0 || num_filter_order_ < 0 || NULL == input_source_ ||
      !input_source->IsValid() ||
      input_source->GetSize() != num_input_order_ + 1) {
    is_valid_ = false;
    return;
  }

  // Prepare memories.
  buffer_.resize(num_input_order_ + 1);
  flat_.resize(apply_each_dimension_
                   ? (num_filter_order_ + 1)
                   : (num_filter_order_ + 1) * buffer_.size());

  // Look ahead.
  const int future(num_filter_order_ / 2);
  count_down_ = future;
  for (int i(0); i < future; ++i) {
    if (!Forward()) {
      is_valid_ = false;
      return;
    }
  }
}